

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
          (ConstraintPrototypeSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *qualifiers,
          Token keyword,SyntaxList<slang::syntax::ClassSpecifierSyntax> *specifiers,NameSyntax *name
          ,Token semi)

{
  pointer ppCVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ConstraintPrototype,attributes);
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (qualifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(qualifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (qualifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (qualifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (this->qualifiers).super_SyntaxListBase.childCount = (qualifiers->super_SyntaxListBase).childCount
  ;
  sVar2 = (qualifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (qualifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0057ac88;
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  uVar4 = *(undefined4 *)&(specifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (specifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (specifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (specifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (this->specifiers).super_SyntaxListBase.childCount = (specifiers->super_SyntaxListBase).childCount
  ;
  sVar2 = (specifiers->super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (this->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (specifiers->super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>).
           _M_ptr;
  (this->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (this->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0057e4a8;
  (this->name).ptr = name;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppCVar1 = (this->specifiers).
            super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (this->specifiers).
          super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(ConstraintPrototypeSyntax **)(*(long *)((long)ppCVar1 + lVar6) + 8) = this;
  }
  (name->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

ConstraintPrototypeSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& qualifiers, Token keyword, const SyntaxList<ClassSpecifierSyntax>& specifiers, NameSyntax& name, Token semi) :
        MemberSyntax(SyntaxKind::ConstraintPrototype, attributes), qualifiers(qualifiers), keyword(keyword), specifiers(specifiers), name(&name), semi(semi) {
        this->qualifiers.parent = this;
        this->specifiers.parent = this;
        for (auto child : this->specifiers)
            child->parent = this;
        this->name->parent = this;
    }